

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int early_term_inter_search_with_sse
              (int early_term_idx,BLOCK_SIZE bsize,int64_t this_sse,int64_t best_sse,
              PREDICTION_MODE this_mode)

{
  double local_38;
  double threshold;
  int size_group;
  PREDICTION_MODE this_mode_local;
  int64_t best_sse_local;
  int64_t this_sse_local;
  BLOCK_SIZE bsize_local;
  int early_term_idx_local;
  int local_4;
  
  if ((early_term_idx == 4) && ((this_mode == '\x10' || (this_mode == '\r')))) {
    local_38 = early_term_inter_search_with_sse::early_term_thresh_newmv_nearestmv
               [(int)(uint)""[bsize]];
  }
  else {
    local_38 = early_term_inter_search_with_sse::early_term_thresh[early_term_idx + -1]
               [(int)(uint)""[bsize]];
  }
  if ((early_term_idx < 1) || (local_38 * (double)this_sse <= (double)best_sse)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int early_term_inter_search_with_sse(int early_term_idx,
                                                   BLOCK_SIZE bsize,
                                                   int64_t this_sse,
                                                   int64_t best_sse,
                                                   PREDICTION_MODE this_mode) {
  // Aggressiveness to terminate inter mode search early is adjusted based on
  // speed and block size.
  static const double early_term_thresh[4][4] = { { 0.65, 0.65, 0.65, 0.7 },
                                                  { 0.6, 0.65, 0.85, 0.9 },
                                                  { 0.5, 0.5, 0.55, 0.6 },
                                                  { 0.6, 0.75, 0.85, 0.85 } };
  static const double early_term_thresh_newmv_nearestmv[4] = { 0.3, 0.3, 0.3,
                                                               0.3 };

  const int size_group = size_group_lookup[bsize];
  assert(size_group < 4);
  assert((early_term_idx > 0) && (early_term_idx < EARLY_TERM_INDICES));
  const double threshold =
      ((early_term_idx == EARLY_TERM_IDX_4) &&
       (this_mode == NEWMV || this_mode == NEARESTMV))
          ? early_term_thresh_newmv_nearestmv[size_group]
          : early_term_thresh[early_term_idx - 1][size_group];

  // Terminate inter mode search early based on best sse so far.
  if ((early_term_idx > 0) && (threshold * this_sse > best_sse)) {
    return 1;
  }
  return 0;
}